

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O0

void __thiscall
duckdb_re2::SparseSetT<void>::MaybeInitializeMemory(SparseSetT<void> *this,int min,int max)

{
  int *piVar1;
  int in_EDX;
  int in_ESI;
  PODArray<int> *in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  undefined4 local_14;
  
  for (local_14 = in_ESI; local_14 < in_EDX; local_14 = local_14 + 1) {
    piVar1 = PODArray<int>::operator[](in_RDI,in_stack_ffffffffffffffdc);
    *piVar1 = -0x54545455;
  }
  return;
}

Assistant:

void MaybeInitializeMemory(int min, int max) {
#if __has_feature(memory_sanitizer)
    __msan_unpoison(sparse_.data() + min, (max - min) * sizeof sparse_[0]);
#elif defined(RE2_ON_VALGRIND)
    for (int i = min; i < max; i++) {
      sparse_[i] = 0xababababU;
    }
#endif
  }